

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O1

double __thiscall Alg::opim(Alg *this,int targetSize,size_t numRRsets,double delta,int mode)

{
  uint uVar1;
  size_t sVar2;
  TResult *pTVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  char local_71;
  double local_70;
  double local_68;
  double dStack_60;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  local_70 = 2.0 / delta;
  dVar8 = log(local_70);
  local_48 = log(local_70);
  HyperGraph::build_n_RRsets(&this->__hyperG,numRRsets >> 1);
  HyperGraph::build_n_RRsets(&this->__hyperGVldt,numRRsets >> 1);
  this->__numRRsets = (this->__hyperG).__numRRsets;
  lVar5 = std::chrono::_V2::system_clock::now();
  local_70 = max_cover(this,targetSize,mode);
  lVar6 = std::chrono::_V2::system_clock::now();
  local_40 = HyperGraph::self_inf_cal(&this->__hyperGVldt,&this->__vecSeed);
  sVar2 = this->__numRRsets;
  uVar1 = this->__numV;
  if (mode == 1) {
    local_38 = this->__boundLast;
  }
  else if (mode == 2) {
    local_38 = this->__boundMin;
  }
  else {
    local_38 = local_70 / 0.6321205588285577;
  }
  auVar11._8_4_ = (int)(sVar2 >> 0x20);
  auVar11._0_8_ = sVar2;
  auVar11._12_4_ = 0x45300000;
  dVar12 = auVar11._8_8_ - 1.9342813113834067e+25;
  dVar13 = dVar12 + ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
  local_68 = dVar13 * local_38;
  dVar13 = (dVar8 + dVar8) / 9.0 + (local_40 * dVar13) / (double)uVar1;
  if (dVar13 < 0.0) {
    dStack_60 = dVar12;
    dVar13 = sqrt(dVar13);
    dVar12 = dStack_60;
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  local_68 = local_68 / (double)uVar1;
  dVar9 = dVar8 * 0.5;
  if (dVar9 < 0.0) {
    dStack_60 = dVar12;
    dVar9 = sqrt(dVar9);
    dVar12 = local_68;
  }
  else {
    dVar9 = SQRT(dVar9);
    dVar12 = local_68;
  }
  local_68 = (double)(lVar6 - lVar5);
  local_50 = (double)(lVar5 - lVar4);
  dVar10 = local_48 * 0.5;
  dVar12 = dVar12 + dVar10;
  if (dVar12 < 0.0) {
    local_48 = dVar10;
    dVar12 = sqrt(dVar12);
    dVar10 = local_48;
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  local_68 = local_68 / 1000000000.0;
  local_50 = local_50 / 1000000000.0;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dVar12 = ((dVar13 - dVar9) * (dVar13 - dVar9) + dVar8 / -18.0) /
           ((dVar12 + dVar10) * (dVar12 + dVar10));
  pTVar3 = this->__tRes;
  pTVar3->__Approx = dVar12;
  lVar5 = std::chrono::_V2::system_clock::now();
  pTVar3->__RunningTime = (double)(lVar5 - lVar4) / 1000000000.0;
  pTVar3 = this->__tRes;
  pTVar3->__Influence = local_40;
  pTVar3->__InfluenceOriginal = local_70;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&pTVar3->__VecSeed,&this->__vecSeed);
  pTVar3->__SeedSize =
       (int)((ulong)((long)(this->__vecSeed).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->__vecSeed).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  this->__tRes->__RRsetsSize = this->__numRRsets * 2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>OPIM approx. (max-cover): ",0x1d);
  poVar7 = std::ostream::_M_insert<double>(dVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," (",2);
  poVar7 = std::ostream::_M_insert<double>(local_70 / local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>Time for RR sets and greedy: ",0x20);
  poVar7 = std::ostream::_M_insert<double>(local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
  poVar7 = std::ostream::_M_insert<double>(local_68);
  local_71 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_71,1);
  pTVar3 = this->__tRes;
  dVar8 = effic_inf_valid_algo(this);
  pTVar3->__Influence = dVar8;
  return dVar12;
}

Assistant:

double Alg::opim(const int targetSize, const size_t numRRsets, const double delta, const int mode)
{
    Timer timerOPIM("OPIM");
    const double e = exp(1);
    const double approx = 1 - 1.0 / e;
    const double a1 = log(2.0 / delta);
    const double a2 = log(2.0 / delta);
    __hyperG.build_n_RRsets(numRRsets / 2); // R1
    __hyperGVldt.build_n_RRsets(numRRsets / 2); // R2
    __numRRsets = __hyperG.get_RR_sets_size();
    const auto time1 = timerOPIM.get_operation_time();
    const auto infSelf = max_cover(targetSize, mode);
    const auto time2 = timerOPIM.get_operation_time();
    const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
    const auto degVldt = infVldt * __numRRsets / __numV;
    auto upperBound = infSelf / approx;
    if (mode == 1) upperBound = __boundLast;
    else if (mode == 2) upperBound = __boundMin;
    const auto upperDegOPT = upperBound * __numRRsets / __numV;
    const auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
    const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
    const auto approxOPIM = lowerSelect / upperOPT;
    //guaranteeOpt = opt_error(degVldt, degSelfUpper, delta);
    __tRes.set_approximation(approxOPIM);
    __tRes.set_running_time(timerOPIM.get_total_time());
    __tRes.set_influence(infVldt);
    __tRes.set_influence_original(infSelf);
    __tRes.set_seed_vec(__vecSeed);
    __tRes.set_RR_sets_size(__numRRsets * 2);
    std::cout << "==>OPIM approx. (max-cover): " << approxOPIM << " (" << infSelf / upperBound << ")\n";
    std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 << '\n';
    __tRes.set_influence(effic_inf_valid_algo());
    return approxOPIM;
}